

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O1

function<void_(TcpSocket_*,_void_*)> * __thiscall
TcpSocket::BindFuncConEstablished
          (function<void_(TcpSocket_*,_void_*)> *__return_storage_ptr__,TcpSocket *this,
          function<void_(TcpSocket_*,_void_*)> *fClientConnected)

{
  BaseSocketImpl *pBVar1;
  long *plVar2;
  _Any_data local_40;
  code *local_30;
  
  pBVar1 = (this->super_BaseSocket).Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  std::function<void_(TcpSocket_*,_void_*)>::function
            ((function<void_(TcpSocket_*,_void_*)> *)&local_40,fClientConnected);
  (**(code **)(*plVar2 + 0xe0))(__return_storage_ptr__,plVar2,&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<void(TcpSocket*, void*)> TcpSocket::BindFuncConEstablished(std::function<void(TcpSocket*, void*)> fClientConnected)
{
    return dynamic_cast<TcpSocketImpl*>(GetImpl())->BindFuncConEstablished(fClientConnected);
}